

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

void __thiscall StressTester::CreateTreeHelper(StressTester *this,TestObject *root,int depth)

{
  Recycler *recycler;
  int iVar1;
  size_t extraBytes;
  TestObject *root_00;
  TestObject *this_00;
  int i;
  int iVar2;
  
  this_00 = (TestObject *)this;
  for (iVar2 = 0; iVar2 < root->pointerCount; iVar2 = iVar2 + 1) {
    recycler = this->recycler;
    if ((depth == 0) || (1000 < this->treeTotal)) {
      iVar1 = PAL_rand();
      root_00 = TestObject::Create(recycler,0,(long)iVar1,LeafObj);
    }
    else {
      extraBytes = GetRandomSize((StressTester *)this_00);
      root_00 = TestObject::Create(recycler,4,extraBytes,NormalObj);
      CreateTreeHelper(this,root_00,depth + -1);
    }
    this_00 = root;
    TestObject::Add(root,root_00);
    this->treeTotal = this->treeTotal + 1;
  }
  return;
}

Assistant:

void StressTester::CreateTreeHelper(TestObject *root, int depth) {
    for (int i = 0; i < root->pointerCount; ++i, ++treeTotal)
    {
        if (depth == 0 || treeTotal > MaxNodesInTree)
        {
            root->Add(TestObject::Create(recycler, 0, rand(), LeafObj));
        }
        else
        {
            TestObject *newObj = TestObject::Create(recycler, 4, GetRandomSize());
            CreateTreeHelper(newObj, depth - 1);
            root->Add(newObj);
        }
    }
}